

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpCodeUtil.cpp
# Opt level: O3

OpCode Js::OpCodeUtil::ConvertProfiledReturnTypeCallOpToNonProfiled(OpCode op)

{
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  undefined4 *puVar4;
  undefined6 in_register_0000003a;
  OpCode OVar5;
  
  if (((uint)CONCAT62(in_register_0000003a,op) & 0xfffffffc) == 0xf8) {
    OVar5 = op - NewScFuncHomeObj;
    OVar3 = DebugConvertProfiledReturnTypeCallToNonProfiled(op);
    if (OVar3 == OVar5) {
      return OVar5;
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/OpCodeUtil.cpp"
                                ,0x9e,"(false)","false");
    if (!bVar2) goto LAB_008a1ce7;
    *puVar4 = 0;
    DebugConvertProfiledReturnTypeCallToNonProfiled(op);
    OVar5 = InvalidOpCode;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/OpCodeUtil.cpp"
                              ,0xa2,
                              "(DebugConvertProfiledReturnTypeCallToNonProfiled(op) == newOpcode)",
                              "DebugConvertProfiledReturnTypeCallToNonProfiled(op) == newOpcode");
  if (bVar2) {
    *puVar4 = 0;
    return OVar5;
  }
LAB_008a1ce7:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

OpCode OpCodeUtil::ConvertProfiledReturnTypeCallOpToNonProfiled(OpCode op)
    {
        OpCode newOpcode = Js::OpCode::InvalidOpCode;
        if (IsProfiledReturnTypeCallOp(op))
        {
            newOpcode = (OpCode)(op - Js::OpCode::ProfiledReturnTypeCallI + Js::OpCode::CallI);
        }
        else
        {
            Assert(false);
            __assume(false);
        }

        Assert(DebugConvertProfiledReturnTypeCallToNonProfiled(op) == newOpcode);
        return newOpcode;
    }